

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O3

void leopard::ff16::FWHT(ffe_t *data,uint m,uint m_truncated)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ushort *puVar15;
  long lVar16;
  bool bVar17;
  ulong local_40;
  
  local_40 = 1;
  uVar4 = 4;
  do {
    if (0 < (int)m) {
      iVar11 = 0;
      uVar10 = (ulong)(uint)((int)local_40 * 2);
      uVar7 = local_40;
      do {
        if (iVar11 < (int)local_40 + iVar11) {
          lVar16 = (long)(int)uVar7 - (long)iVar11;
          puVar15 = data + iVar11;
          do {
            uVar3 = *(ushort *)((long)puVar15 + uVar10);
            uVar8 = (uint)uVar3 + (uint)*puVar15;
            uVar5 = (uint)*puVar15 - (uint)uVar3;
            uVar6 = (uint)puVar15[local_40 * 3] + (uint)puVar15[local_40 * 2];
            uVar9 = (uint)puVar15[local_40 * 2] - (uint)puVar15[local_40 * 3];
            uVar13 = (uVar8 >> 0x10) + uVar8 & 0xffff;
            uVar8 = (uVar5 >> 0x10) + uVar5 & 0xffff;
            uVar6 = (uVar6 >> 0x10) + uVar6 & 0xffff;
            uVar5 = (uVar9 >> 0x10) + uVar9 & 0xffff;
            iVar1 = uVar6 + uVar13;
            iVar14 = uVar13 - uVar6;
            iVar2 = uVar5 + uVar8;
            iVar12 = uVar8 - uVar5;
            *puVar15 = (short)((uint)iVar1 >> 0x10) + (short)iVar1;
            *(short *)((long)puVar15 + uVar10) = (short)((uint)iVar2 >> 0x10) + (short)iVar2;
            puVar15[local_40 * 2] = (short)((uint)iVar14 >> 0x10) + (short)iVar14;
            puVar15[local_40 * 3] = (short)((uint)iVar12 >> 0x10) + (short)iVar12;
            puVar15 = puVar15 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        iVar11 = iVar11 + uVar4;
        uVar7 = (ulong)((int)uVar7 + uVar4);
      } while (iVar11 < (int)m);
    }
    local_40 = (ulong)uVar4;
    bVar17 = uVar4 < 0x4001;
    uVar4 = uVar4 * 4;
  } while (bVar17);
  return;
}

Assistant:

static void FWHT(ffe_t* data, const unsigned m, const unsigned m_truncated)
{
    // Decimation in time: Unroll 2 layers at a time
    unsigned dist = 1, dist4 = 4;
    for (; dist4 <= m; dist = dist4, dist4 <<= 2)
    {
        // For each set of dist*4 elements:
#pragma omp parallel for
        for (int r = 0; r < (int)m_truncated; r += dist4)
        {
            // For each set of dist elements:
            const int i_end = r + dist;
            for (int i = r; i < i_end; ++i)
                FWHT_4(data + i, dist);
        }
    }

    // If there is one layer left:
    if (dist < m)
#pragma omp parallel for
        for (int i = 0; i < (int)dist; ++i)
            FWHT_2(data[i], data[i + dist]);
}